

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleUVColsUp2_C(uint8_t *dst_uv,uint8_t *src_uv,int dst_width,int x,int dx)

{
  uint16_t uVar1;
  int j;
  uint16_t *dst;
  uint16_t *src;
  int dx_local;
  int x_local;
  int dst_width_local;
  uint8_t *src_uv_local;
  uint8_t *dst_uv_local;
  
  dst = (uint16_t *)dst_uv;
  src = (uint16_t *)src_uv;
  for (j = 0; j < dst_width + -1; j = j + 2) {
    uVar1 = *src;
    *dst = uVar1;
    dst[1] = uVar1;
    src = src + 1;
    dst = dst + 2;
  }
  if ((dst_width & 1U) != 0) {
    *dst = *src;
  }
  return;
}

Assistant:

void ScaleUVColsUp2_C(uint8_t* dst_uv,
                      const uint8_t* src_uv,
                      int dst_width,
                      int x,
                      int dx) {
  const uint16_t* src = (const uint16_t*)(src_uv);
  uint16_t* dst = (uint16_t*)(dst_uv);
  int j;
  (void)x;
  (void)dx;
  for (j = 0; j < dst_width - 1; j += 2) {
    dst[1] = dst[0] = src[0];
    src += 1;
    dst += 2;
  }
  if (dst_width & 1) {
    dst[0] = src[0];
  }
}